

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtlsbackend.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_4f207b::BackendCollection::tryPopulateCollection(BackendCollection *this)

{
  long lVar1;
  Type *pTVar2;
  size_type sVar3;
  long lVar4;
  vector<QTlsBackend_*,_std::allocator<QTlsBackend_*>_> *in_RDI;
  long in_FS_OFFSET;
  int index;
  QMutexLocker<QBasicMutex> locker;
  QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qtlsbLoader>_>
  *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  bool local_19;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pTVar2 = QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qtlsbLoader>_>
           ::operator()(in_stack_ffffffffffffffb8);
  if (pTVar2 == (Type *)0x0) {
    local_19 = false;
  }
  else {
    QMutexLocker<QBasicMutex>::QMutexLocker
              ((QMutexLocker<QBasicMutex> *)
               CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
               (QBasicMutex *)in_stack_ffffffffffffffb8);
    sVar3 = std::vector<QTlsBackend_*,_std::allocator<QTlsBackend_*>_>::size(in_RDI);
    if (sVar3 == 0) {
      QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qtlsbLoader>_>::
      operator->((QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qtlsbLoader>_>
                  *)0x27b1e1);
      QFactoryLoader::update();
      do {
        pTVar2 = QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qtlsbLoader>_>
                 ::operator->((QGlobalStatic<QtGlobalStatic::ApplicationHolder<(anonymous_namespace)::Q_QAS_qtlsbLoader>_>
                               *)0x27b1fd);
        lVar4 = QFactoryLoader::instance((int)pTVar2);
      } while (lVar4 != 0);
    }
    local_19 = true;
    QMutexLocker<QBasicMutex>::~QMutexLocker
              ((QMutexLocker<QBasicMutex> *)
               CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_19;
}

Assistant:

bool tryPopulateCollection()
    {
        if (!qtlsbLoader())
            return false;

        Q_CONSTINIT static QBasicMutex mutex;
        const QMutexLocker locker(&mutex);
        if (backends.size())
            return true;

#if QT_CONFIG(library)
        qtlsbLoader->update();
#endif
        int index = 0;
        while (qtlsbLoader->instance(index))
            ++index;

        return true;
    }